

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O3

matrix4d *
tinyusdz::inverse_pxr(matrix4d *__return_storage_ptr__,matrix4d *m,double *detp,double eps)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dStack_120;
  undefined4 uStack_104;
  undefined4 uStack_100;
  double dStack_f0;
  double dStack_60;
  double dStack_50;
  
  dVar30 = m->m[0][0];
  dVar32 = m->m[0][1];
  dVar1 = m->m[1][0];
  dVar2 = m->m[3][0];
  dVar3 = m->m[0][2];
  dVar4 = m->m[2][2];
  dVar17 = m->m[1][1];
  dVar5 = m->m[0][3];
  dVar6 = m->m[2][3];
  dVar13 = dVar3 * dVar6 - dVar5 * dVar4;
  dVar20 = dVar30 * dVar17 - dVar32 * dVar1;
  dVar14 = m->m[3][2];
  dVar7 = m->m[3][3];
  dVar18 = m->m[3][1];
  dVar33 = dVar3 * dVar7 - dVar5 * dVar14;
  dVar34 = dVar30 * dVar18 - dVar32 * dVar2;
  dVar25 = dVar7 * dVar4 - dVar6 * dVar14;
  dVar26 = dVar18 * dVar1 - dVar17 * dVar2;
  dVar29 = -dVar14;
  dVar31 = -dVar2;
  dVar8 = m->m[1][2];
  dVar15 = m->m[1][3];
  dVar16 = m->m[2][0];
  dVar24 = dVar8 * dVar7 + dVar15 * dVar29;
  dVar21 = -dVar4;
  auVar9._8_4_ = SUB84(dVar8,0);
  auVar9._0_8_ = -dVar5;
  auVar9._12_4_ = (int)((ulong)-dVar8 >> 0x20);
  auVar11._8_4_ = SUB84(dVar8,0);
  auVar11._0_8_ = dVar3;
  auVar11._12_4_ = (int)((ulong)dVar8 >> 0x20);
  dVar27 = dVar15 * dVar3 + -dVar8 * dVar5;
  dVar28 = dVar6 * dVar8 + dVar21 * dVar15;
  dVar19 = m->m[2][1];
  auVar12._8_4_ = SUB84(dVar20,0);
  auVar12._0_8_ = dVar13;
  auVar12._12_4_ = (int)((ulong)dVar20 >> 0x20);
  dVar35 = dVar18 * dVar27 + dVar32 * dVar24 + -dVar17 * dVar33;
  dVar36 = -dVar32 * dVar28 + dVar17 * dVar13 + dVar27 * -dVar19;
  dVar22 = dVar28 * dVar18 + (dVar25 * dVar17 - dVar24 * dVar19);
  dVar23 = dVar25 * -dVar32 + (dVar33 * dVar19 - dVar13 * dVar18);
  dVar20 = dVar30 * dVar22 + dVar23 * dVar1 + dVar36 * dVar2 + dVar16 * dVar35;
  if (detp != (double *)0x0) {
    *detp = dVar20;
  }
  if (ABS(dVar20) <= eps) {
    __return_storage_ptr__->m[0][3] = 0.0;
    __return_storage_ptr__->m[1][0] = 0.0;
    __return_storage_ptr__->m[0][1] = 0.0;
    __return_storage_ptr__->m[0][2] = 0.0;
    __return_storage_ptr__->m[2][0] = 0.0;
    __return_storage_ptr__->m[2][1] = 0.0;
    __return_storage_ptr__->m[1][2] = 0.0;
    __return_storage_ptr__->m[1][3] = 0.0;
    __return_storage_ptr__->m[3][1] = 0.0;
    __return_storage_ptr__->m[3][2] = 0.0;
    __return_storage_ptr__->m[2][3] = 0.0;
    __return_storage_ptr__->m[3][0] = 0.0;
    __return_storage_ptr__->m[1][1] = 1.0;
    __return_storage_ptr__->m[2][2] = 1.0;
    __return_storage_ptr__->m[0][0] = 3.4028234663852886e+38;
    dVar30 = 3.4028234663852886e+38;
    dVar32 = 3.4028234663852886e+38;
    dVar20 = 1.0;
  }
  else {
    dVar17 = dVar1 * dVar19 + dVar17 * -dVar16;
    dVar18 = dVar16 * dVar18 + dVar19 * dVar31;
    dVar19 = dVar19 * dVar30 + dVar32 * -dVar16;
    dStack_f0 = auVar12._8_8_;
    auVar10._8_4_ = SUB84(dVar29 * dStack_f0,0);
    auVar10._0_8_ = dVar21 * dVar34;
    auVar10._12_4_ = (int)((ulong)(dVar29 * dStack_f0) >> 0x20);
    dStack_60 = auVar9._8_8_;
    dStack_50 = auVar11._8_8_;
    dStack_120 = auVar10._8_8_;
    uStack_104 = (undefined4)((ulong)dVar21 >> 0x20);
    uStack_100 = SUB84(-dVar1,0);
    dVar20 = 1.0 / dVar20;
    __return_storage_ptr__->m[0][0] = dVar22 * dVar20;
    __return_storage_ptr__->m[0][1] = dVar23 * dVar20;
    __return_storage_ptr__->m[1][0] =
         ((double)CONCAT44(uStack_104,uStack_100) * dVar25 + dVar28 * dVar31 + dVar16 * dVar24) *
         dVar20;
    __return_storage_ptr__->m[0][2] = dVar35 * dVar20;
    __return_storage_ptr__->m[0][3] = dVar36 * dVar20;
    __return_storage_ptr__->m[2][0] = (dVar7 * dVar17 + (dVar18 * dVar15 - dVar26 * dVar6)) * dVar20
    ;
    __return_storage_ptr__->m[2][1] = (-dVar5 * dVar18 + (dVar6 * dVar34 - dVar19 * dVar7)) * dVar20
    ;
    __return_storage_ptr__->m[1][2] = (dVar24 * -dVar30 + dVar33 * dVar1 + dVar31 * dVar27) * dVar20
    ;
    __return_storage_ptr__->m[1][3] = (dVar27 * dVar16 + dVar28 * dVar30 + -dVar1 * dVar13) * dVar20
    ;
    __return_storage_ptr__->m[2][3] =
         ((dVar19 * dVar15 + -dVar6 * dStack_f0) - dVar5 * dVar17) * dVar20;
    __return_storage_ptr__->m[3][0] = ((dVar4 * dVar26 + dVar29 * dVar17) - dVar8 * dVar18) * dVar20
    ;
    dVar30 = (dVar2 * dVar13 + (dVar30 * dVar25 - dVar16 * dVar33)) * dVar20;
    dVar32 = (dVar7 * dStack_f0 + (dVar5 * dVar26 - dVar15 * dVar34)) * dVar20;
    __return_storage_ptr__->m[3][1] = dVar20 * (dVar19 * dVar14 + dVar3 * dVar18 + dVar21 * dVar34);
    __return_storage_ptr__->m[3][2] = dVar20 * (dVar26 * -dVar3 + dStack_50 * dVar34 + dStack_120);
    dVar20 = dVar20 * (dStack_f0 * dVar4 + dVar3 * dVar17 + dStack_60 * dVar19);
  }
  __return_storage_ptr__->m[1][1] = dVar30;
  __return_storage_ptr__->m[2][2] = dVar32;
  __return_storage_ptr__->m[3][3] = dVar20;
  return __return_storage_ptr__;
}

Assistant:

value::matrix4d inverse_pxr(const value::matrix4d &m, double *detp,
                            double eps) {
  double x00, x01, x02, x03;
  double x10, x11, x12, x13;
  double x20, x21, x22, x23;
  double x30, x31, x32, x33;
  double y01, y02, y03, y12, y13, y23;
  double z00, z10, z20, z30;
  double z01, z11, z21, z31;
  double z02, z03, z12, z13, z22, z23, z32, z33;

  // Pickle 1st two columns of matrix into registers
  x00 = m.m[0][0];
  x01 = m.m[0][1];
  x10 = m.m[1][0];
  x11 = m.m[1][1];
  x20 = m.m[2][0];
  x21 = m.m[2][1];
  x30 = m.m[3][0];
  x31 = m.m[3][1];

  // Compute all six 2x2 determinants of 1st two columns
  y01 = x00 * x11 - x10 * x01;
  y02 = x00 * x21 - x20 * x01;
  y03 = x00 * x31 - x30 * x01;
  y12 = x10 * x21 - x20 * x11;
  y13 = x10 * x31 - x30 * x11;
  y23 = x20 * x31 - x30 * x21;

  // Pickle 2nd two columns of matrix into registers
  x02 = m.m[0][2];
  x03 = m.m[0][3];
  x12 = m.m[1][2];
  x13 = m.m[1][3];
  x22 = m.m[2][2];
  x23 = m.m[2][3];
  x32 = m.m[3][2];
  x33 = m.m[3][3];

  // Compute all 3x3 cofactors for 2nd two columns */
  z33 = x02 * y12 - x12 * y02 + x22 * y01;
  z23 = x12 * y03 - x32 * y01 - x02 * y13;
  z13 = x02 * y23 - x22 * y03 + x32 * y02;
  z03 = x22 * y13 - x32 * y12 - x12 * y23;
  z32 = x13 * y02 - x23 * y01 - x03 * y12;
  z22 = x03 * y13 - x13 * y03 + x33 * y01;
  z12 = x23 * y03 - x33 * y02 - x03 * y23;
  z02 = x13 * y23 - x23 * y13 + x33 * y12;

  // Compute all six 2x2 determinants of 2nd two columns
  y01 = x02 * x13 - x12 * x03;
  y02 = x02 * x23 - x22 * x03;
  y03 = x02 * x33 - x32 * x03;
  y12 = x12 * x23 - x22 * x13;
  y13 = x12 * x33 - x32 * x13;
  y23 = x22 * x33 - x32 * x23;

  // Compute all 3x3 cofactors for 1st two columns
  z30 = x11 * y02 - x21 * y01 - x01 * y12;
  z20 = x01 * y13 - x11 * y03 + x31 * y01;
  z10 = x21 * y03 - x31 * y02 - x01 * y23;
  z00 = x11 * y23 - x21 * y13 + x31 * y12;
  z31 = x00 * y12 - x10 * y02 + x20 * y01;
  z21 = x10 * y03 - x30 * y01 - x00 * y13;
  z11 = x00 * y23 - x20 * y03 + x30 * y02;
  z01 = x20 * y13 - x30 * y12 - x10 * y23;

  // compute 4x4 determinant & its reciprocal
  double det = x30 * z30 + x20 * z20 + x10 * z10 + x00 * z00;
  if (detp) {
    *detp = det;
  }

  value::matrix4d inv;

  if (std::fabs(det) > eps) {
    double rcp = 1.0 / det;
    // Multiply all 3x3 cofactors by reciprocal & transpose
    inv.m[0][0] = z00 * rcp;
    inv.m[0][1] = z10 * rcp;
    inv.m[1][0] = z01 * rcp;
    inv.m[0][2] = z20 * rcp;
    inv.m[2][0] = z02 * rcp;
    inv.m[0][3] = z30 * rcp;
    inv.m[3][0] = z03 * rcp;
    inv.m[1][1] = z11 * rcp;
    inv.m[1][2] = z21 * rcp;
    inv.m[2][1] = z12 * rcp;
    inv.m[1][3] = z31 * rcp;
    inv.m[3][1] = z13 * rcp;
    inv.m[2][2] = z22 * rcp;
    inv.m[2][3] = z32 * rcp;
    inv.m[3][2] = z23 * rcp;
    inv.m[3][3] = z33 * rcp;

  } else {
    inv = value::matrix4d::identity();
    // scale = FLT_MAX
    inv.m[0][0] = double((std::numeric_limits<float>::max)());
    inv.m[1][1] = double((std::numeric_limits<float>::max)());
    inv.m[2][2] = double((std::numeric_limits<float>::max)());
    // [3][3] = 1.0
  }

  return inv;
}